

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

void __thiscall snmalloc::MessageBuilder<1024UL>::append(MessageBuilder<1024UL> *this,char *ptr)

{
  char c;
  MessageBuilder<1024UL> *in_RSI;
  MessageBuilder<1024UL> *in_RDI;
  char data;
  void *in_stack_ffffffffffffffd8;
  MessageBuilder<1024UL> *this_00;
  
  if (in_RSI == (MessageBuilder<1024UL> *)0x0) {
    append(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    while( true ) {
      this_00 = (MessageBuilder<1024UL> *)((in_RSI->buffer)._M_elems + 1);
      c = (in_RSI->buffer)._M_elems[0];
      if (c == '\0') break;
      append_char(this_00,c);
      in_RSI = this_00;
    }
  }
  return;
}

Assistant:

void append(const char* ptr)
    {
      if (ptr == nullptr)
      {
        append(nullptr);
        return;
      }

      while (char data = *ptr++)
      {
        append_char(data);
      }
    }